

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O2

lzma_ret lzma_properties_size(uint32_t *size,lzma_filter *filter)

{
  lzma_vli id;
  lzma_ret lVar1;
  lzma_filter_encoder *plVar2;
  
  id = filter->id;
  plVar2 = encoder_find(id);
  if (plVar2 == (lzma_filter_encoder *)0x0) {
    lVar1 = (int)((long)id >> 0x3f) * -3 + LZMA_OPTIONS_ERROR;
  }
  else {
    if (plVar2->props_size_get != (_func_lzma_ret_uint32_t_ptr_void_ptr *)0x0) {
      lVar1 = (*plVar2->props_size_get)(size,filter->options);
      return lVar1;
    }
    *size = plVar2->props_size_fixed;
    lVar1 = LZMA_OK;
  }
  return lVar1;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_properties_size(uint32_t *size, const lzma_filter *filter)
{
	const lzma_filter_encoder *const fe = encoder_find(filter->id);
	if (fe == NULL) {
		// Unknown filter - if the Filter ID is a proper VLI,
		// return LZMA_OPTIONS_ERROR instead of LZMA_PROG_ERROR,
		// because it's possible that we just don't have support
		// compiled in for the requested filter.
		return filter->id <= LZMA_VLI_MAX
				? LZMA_OPTIONS_ERROR : LZMA_PROG_ERROR;
	}

	if (fe->props_size_get == NULL) {
		// No props_size_get() function, use props_size_fixed.
		*size = fe->props_size_fixed;
		return LZMA_OK;
	}

	return fe->props_size_get(size, filter->options);
}